

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint addChunk_cICP(ucvector *out,LodePNGInfo *info)

{
  uint uVar1;
  uchar *chunk;
  uchar *local_10;
  
  uVar1 = 0x74;
  if ((((info->cicp_color_primaries < 0x100) && (info->cicp_transfer_function < 0x100)) &&
      (info->cicp_matrix_coefficients < 0x100)) && (info->cicp_video_full_range_flag < 0x100)) {
    uVar1 = lodepng_chunk_init(&local_10,out,4,"cICP");
    if (uVar1 == 0) {
      local_10[8] = (uchar)info->cicp_color_primaries;
      local_10[9] = (uchar)info->cicp_transfer_function;
      local_10[10] = (uchar)info->cicp_matrix_coefficients;
      local_10[0xb] = (uchar)info->cicp_video_full_range_flag;
      lodepng_chunk_generate_crc(local_10);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

static unsigned addChunk_cICP(ucvector* out, const LodePNGInfo* info) {
  unsigned char* chunk;
  /* Allow up to 255 since they are bytes. The ITU-R-BT.709 spec has a more
  restricted set of valid values for each field, but that's up to the error
  handling of a CICP library, not the PNG encoding/decoding, to manage. */
  if(info->cicp_color_primaries > 255) return 116;
  if(info->cicp_transfer_function > 255) return 116;
  if(info->cicp_matrix_coefficients > 255) return 116;
  if(info->cicp_video_full_range_flag > 255) return 116;
  CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 4, "cICP"));
  chunk[8 + 0] = (unsigned char)info->cicp_color_primaries;
  chunk[8 + 1] = (unsigned char)info->cicp_transfer_function;
  chunk[8 + 2] = (unsigned char)info->cicp_matrix_coefficients;
  chunk[8 + 3] = (unsigned char)info->cicp_video_full_range_flag;
  lodepng_chunk_generate_crc(chunk);
  return 0;
}